

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O0

void __thiscall
Refal2::COperationsBuilder::AddMatchClosed_V
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  bool bVar1;
  TOperationType TVar2;
  bool saveInTable_local;
  CQualifier *qualifier_local;
  COperationsBuilder *this_local;
  
  bVar1 = CQualifier::IsEmpty(qualifier);
  if (bVar1) {
    TVar2 = OT_MatchClosed_V;
    if (saveInTable) {
      TVar2 = OT_MatchClosedSaveToTable_V;
    }
    addNoArgumensOperation(this,TVar2);
  }
  else {
    TVar2 = OT_MatchClosedWithQualifier_V;
    if (saveInTable) {
      TVar2 = OT_MatchClosedWithQualifierSaveToTable_V;
    }
    addQualifierIndexOperation(this,TVar2,qualifier);
  }
  return;
}

Assistant:

void COperationsBuilder::AddMatchClosed_V( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		addNoArgumensOperation(
			( saveInTable ? OT_MatchClosedSaveToTable_V : OT_MatchClosed_V ) );
	} else {
		addQualifierIndexOperation(
			( saveInTable ? OT_MatchClosedWithQualifierSaveToTable_V :
			 OT_MatchClosedWithQualifier_V ), qualifier );
	}
}